

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtmpfil.cpp
# Opt level: O0

int __thiscall
CVmObjTemporaryFile::getp_getFilename
          (CVmObjTemporaryFile *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  vm_obj_id_t obj;
  vm_tmpfil_ext *pvVar2;
  vm_val_t *in_RDX;
  vm_val_t *in_RDI;
  vm_tmpfil_ext *ext;
  CVmNativeCodeDesc *in_stack_ffffffffffffffa8;
  uint *in_stack_ffffffffffffffb0;
  
  if ((getp_getFilename(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_getFilename(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_getFilename::desc,0);
    __cxa_guard_release(&getp_getFilename(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc(in_RDI,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8)
  ;
  if (iVar1 == 0) {
    pvVar2 = get_ext((CVmObjTemporaryFile *)in_RDI);
    if (pvVar2->filename[0] == '\0') {
      vm_val_t::set_nil(in_RDX);
    }
    else {
      obj = CVmBif::str_from_ui_str((char *)in_RDX);
      vm_val_t::set_obj(in_RDX,obj);
    }
  }
  return 1;
}

Assistant:

int CVmObjTemporaryFile::getp_getFilename(VMG_ vm_obj_id_t self,
                                          vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* if we have a filename, return it, otherwise return nil */
    vm_tmpfil_ext *ext = get_ext();
    if (ext->filename[0] != '\0')
    {
        /* return the filename */
        retval->set_obj(CVmBif::str_from_ui_str(vmg_ ext->filename));
    }
    else
    {
        /* no filename */
        retval->set_nil();
    }

    /* handled */
    return TRUE;
}